

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d715c4::Scenario::Check
          (Scenario *this,NodeId peer,vector<GenTxid,_std::allocator<GenTxid>_> *expected,
          size_t candidates,size_t inflight,size_t completed,string *checkname,microseconds offset)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000L>_> *__args;
  anon_class_112_9_1179051b *__args_1;
  long in_RDI;
  vector<GenTxid,_std::allocator<GenTxid>_> *in_R8;
  vector<GenTxid,_std::allocator<GenTxid>_> *in_R9;
  long in_FS_OFFSET;
  Runner *runner;
  microseconds now;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comment;
  anon_class_112_9_1179051b *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  local_80 [2];
  char local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(in_stack_fffffffffffffef0,local_48);
  std::operator+(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8);
  lVar2 = *(long *)(in_RDI + 8);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffeb8);
  if (0 < rVar1) {
    __assert_fail("offset.count() <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
                  ,0xaa,
                  "void (anonymous namespace)::Scenario::Check(NodeId, const std::vector<GenTxid> &, size_t, size_t, size_t, const std::string &, std::chrono::microseconds)"
                 );
  }
  __args_1 = (anon_class_112_9_1179051b *)(lVar2 + 8);
  __args = (duration<long,_std::ratio<1L,_1000000L>_> *)(in_RDI + 0x10);
  this_00 = local_80;
  std::__cxx11::string::string(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  _GLOBAL__N_1::std::vector<GenTxid,_std::allocator<GenTxid>_>::vector(in_R8,in_R9);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
            (this_00,__args,__args_1);
  ::(anonymous_namespace)::Scenario::
  Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)
  ::{lambda()#1}::~duration(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Check(NodeId peer, const std::vector<GenTxid>& expected, size_t candidates, size_t inflight,
        size_t completed, const std::string& checkname,
        std::chrono::microseconds offset = std::chrono::microseconds{0})
    {
        const auto comment = m_testname + " " + checkname;
        auto& runner = m_runner;
        const auto now = m_now;
        assert(offset.count() <= 0);
        runner.actions.emplace_back(m_now, [=,&runner]() {
            std::vector<std::pair<NodeId, GenTxid>> expired_now;
            auto ret = runner.txrequest.GetRequestable(peer, now + offset, &expired_now);
            for (const auto& entry : expired_now) runner.expired.insert(entry);
            runner.txrequest.SanityCheck();
            runner.txrequest.PostGetRequestableSanityCheck(now + offset);
            size_t total = candidates + inflight + completed;
            size_t real_total = runner.txrequest.Count(peer);
            size_t real_candidates = runner.txrequest.CountCandidates(peer);
            size_t real_inflight = runner.txrequest.CountInFlight(peer);
            BOOST_CHECK_MESSAGE(real_total == total, strprintf("[" + comment + "] total %i (%i expected)", real_total, total));
            BOOST_CHECK_MESSAGE(real_inflight == inflight, strprintf("[" + comment + "] inflight %i (%i expected)", real_inflight, inflight));
            BOOST_CHECK_MESSAGE(real_candidates == candidates, strprintf("[" + comment + "] candidates %i (%i expected)", real_candidates, candidates));
            BOOST_CHECK_MESSAGE(ret == expected, "[" + comment + "] mismatching requestables");
        });
    }